

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::Initialize(DynamicProfileInfo *this,FunctionBody *functionBody)

{
  Type TVar1;
  ushort uVar2;
  FldInfo *pFVar3;
  ProfileId i_3;
  ProfileId PVar4;
  uint uVar5;
  ulong in_RAX;
  long lVar6;
  ScriptContext *pSVar7;
  ProfileId i_1;
  ulong uVar8;
  ProfileId *pPVar9;
  uint i_6;
  BVIndex start;
  uint i;
  uint uVar10;
  undefined8 uStack_38;
  LoopFlags defaultValues;
  
  (this->thisInfo).valueType.field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  uStack_38 = in_RAX;
  uVar5 = FunctionBody::GetLoopCount(functionBody);
  if (uVar5 * 2 != 0) {
    BVFixed::Init((this->loopFlags).ptr,uVar5 * 2);
    uStack_38 = uStack_38 & 0xffffffffffffff;
    start = 0;
    uVar10 = 0;
    while( true ) {
      uVar5 = FunctionBody::GetLoopCount(functionBody);
      if (uVar5 <= uVar10) break;
      BVFixed::SetRange<Js::LoopFlags>
                ((this->loopFlags).ptr,(LoopFlags *)((long)&uStack_38 + 7),start,2);
      uVar10 = uVar10 + 1;
      start = start + 2;
    }
  }
  lVar6 = 0;
  for (uVar8 = 0; uVar8 < functionBody->profiledCallSiteCount; uVar8 = uVar8 + 1) {
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
    ((long)&(((this->callSiteInfo).ptr)->returnType).field_0 + lVar6))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    *(undefined4 *)((long)&((this->callSiteInfo).ptr)->u + lVar6) = 0xffffffff;
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 0;
  uVar8 = 0;
  while( true ) {
    PVar4 = FunctionBody::GetProfiledCallApplyCallSiteCount(functionBody);
    if (PVar4 <= uVar8) break;
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
    ((long)&(((this->callApplyTargetInfo).ptr)->returnType).field_0 + lVar6))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    *(undefined4 *)((long)&((this->callApplyTargetInfo).ptr)->u + lVar6) = 0xffffffff;
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 0x10;
  }
  for (uVar8 = 0; uVar8 < functionBody->profiledLdLenCount; uVar8 = uVar8 + 1) {
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)((this->ldLenInfo).ptr + uVar8))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  }
  lVar6 = 0;
  for (uVar8 = 0; uVar8 < functionBody->profiledLdElemCount; uVar8 = uVar8 + 1) {
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
    ((long)&(((this->ldElemInfo).ptr)->arrayType).field_0 + lVar6))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)
    ((long)&(((this->ldElemInfo).ptr)->elemType).field_0 + lVar6))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    (&((this->ldElemInfo).ptr)->flags)[lVar6] = FldInfo_NoInfo;
    lVar6 = lVar6 + 6;
  }
  for (uVar8 = 0; uVar8 < functionBody->profiledStElemCount; uVar8 = uVar8 + 1) {
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)((this->stElemInfo).ptr + uVar8))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    (this->stElemInfo).ptr[uVar8].flags = FldInfo_NoInfo;
  }
  uVar8 = 0;
  while( true ) {
    uVar5 = FunctionBody::GetInlineCacheCount(functionBody);
    if (uVar5 <= uVar8) break;
    pFVar3 = (this->fldInfo).ptr;
    pFVar3[uVar8].flags = FldInfo_NoInfo;
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(pFVar3 + uVar8))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    (this->fldInfo).ptr[uVar8].polymorphicInlineCacheUtilization = 0x80;
    uVar8 = uVar8 + 1;
  }
  for (uVar8 = 0; uVar8 < functionBody->profiledDivOrRemCount; uVar8 = uVar8 + 1) {
    (this->divideTypeInfo).ptr[uVar8].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  }
  for (uVar8 = 0; uVar8 < functionBody->profiledSwitchCount; uVar8 = uVar8 + 1) {
    (this->switchTypeInfo).ptr[uVar8].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  }
  for (uVar8 = 0; uVar8 < functionBody->profiledSlotCount; uVar8 = uVar8 + 1) {
    (this->slotInfo).ptr[uVar8].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  }
  uVar8 = 0;
  while( true ) {
    TVar1 = (functionBody->super_ParseableFunctionInfo).m_inParamCount;
    uVar10 = (uint)(ushort)(TVar1 - 1);
    if (TVar1 == 0) {
      uVar10 = 0;
    }
    if (uVar10 <= uVar8) break;
    (this->parameterInfo).ptr[uVar8].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    uVar8 = uVar8 + 1;
  }
  for (uVar8 = 0; uVar8 < functionBody->profiledReturnTypeCount; uVar8 = uVar8 + 1) {
    (this->returnTypeInfo).ptr[uVar8].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  }
  this->rejitCount = 0;
  this->bailOutOffsetForLastRejit = 0xffffffff;
  uVar2 = functionBody->profiledArrayCallSiteCount;
  pPVar9 = &((this->arrayCallSiteInfo).ptr)->callSiteNumber;
  for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
    *(Type *)(pPVar9 + -2) =
         (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber;
    *pPVar9 = (ProfileId)uVar8;
    pPVar9 = pPVar9 + 6;
  }
  pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (pSVar7->threadContext->TTDLog != (EventLog *)0x0) {
    lVar6 = 0;
    for (uVar8 = 0; uVar8 < functionBody->profiledArrayCallSiteCount; uVar8 = uVar8 + 1) {
      ArrayCallSiteInfo::SetIsNotNativeArray
                ((ArrayCallSiteInfo *)(&((this->arrayCallSiteInfo).ptr)->field_0 + lVar6));
      lVar6 = lVar6 + 0xc;
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::Initialize(FunctionBody *const functionBody)
    {
        // Need to make value types uninitialized, which is not equivalent to zero
        thisInfo.valueType = ValueType::Uninitialized;
        const BVIndex loopFlagsCount = functionBody->GetLoopCount() * LoopFlags::COUNT;
        if (loopFlagsCount)
        {
            this->loopFlags->Init(loopFlagsCount);
            LoopFlags defaultValues;
            for (uint i = 0; i < functionBody->GetLoopCount(); ++i)
            {
                this->loopFlags->SetRange(&defaultValues, i * LoopFlags::COUNT, LoopFlags::COUNT);
            }
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledCallSiteCount(); ++i)
        {
            callSiteInfo[i].returnType = ValueType::Uninitialized;
            callSiteInfo[i].u.functionData.sourceId = NoSourceId;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledCallApplyCallSiteCount(); ++i)
        {
            callApplyTargetInfo[i].returnType = ValueType::Uninitialized;
            callApplyTargetInfo[i].u.functionData.sourceId = NoSourceId;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledLdLenCount(); ++i)
        {
            ldLenInfo[i].arrayType = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledLdElemCount(); ++i)
        {
            ldElemInfo[i].arrayType = ValueType::Uninitialized;
            ldElemInfo[i].elemType = ValueType::Uninitialized;
            ldElemInfo[i].flags = Js::FldInfo_NoInfo;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledStElemCount(); ++i)
        {
            stElemInfo[i].arrayType = ValueType::Uninitialized;
            stElemInfo[i].flags = Js::FldInfo_NoInfo;
        }
        for (uint i = 0; i < functionBody->GetProfiledFldCount(); ++i)
        {
            fldInfo[i].flags = FldInfo_NoInfo;
            fldInfo[i].valueType = ValueType::Uninitialized;
            fldInfo[i].polymorphicInlineCacheUtilization = PolymorphicInlineCacheUtilizationThreshold;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledDivOrRemCount(); ++i)
        {
            divideTypeInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledSwitchCount(); ++i)
        {
            switchTypeInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledSlotCount(); ++i)
        {
            slotInfo[i] = ValueType::Uninitialized;
        }
        for (ArgSlot i = 0; i < functionBody->GetProfiledInParamsCount(); ++i)
        {
            parameterInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledReturnTypeCount(); ++i)
        {
            returnTypeInfo[i] = ValueType::Uninitialized;
        }

        this->rejitCount = 0;
        this->bailOutOffsetForLastRejit = Js::Constants::NoByteCodeOffset;
#if DBG
        for (ProfileId i = 0; i < functionBody->GetProfiledArrayCallSiteCount(); ++i)
        {
            arrayCallSiteInfo[i].functionNumber = functionBody->GetFunctionNumber();
            arrayCallSiteInfo[i].callSiteNumber = i;
        }
#endif

#if TTD_NATIVE_PROFILE_ARRAY_WORK_AROUND
        if(functionBody->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode())
        {
            for(ProfileId i = 0; i < functionBody->GetProfiledArrayCallSiteCount(); ++i)
            {
                arrayCallSiteInfo[i].SetIsNotNativeArray();
            }
        }
#endif
    }